

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dot.hpp
# Opt level: O0

void remora::bindings::
     dot<remora::dense_vector_adaptor<double,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,double>
               (vector_expression<remora::dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1,
               vector_expression<remora::dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
               *param_2,double *param_3)

{
  bool bVar1;
  reference pdVar2;
  const_iterator v1_pos;
  const_iterator v2_pos;
  const_iterator v1_end;
  dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffff90;
  double dVar3;
  random_access_iterator_base<remora::iterators::dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>,_double,_remora::iterators::dense_random_access_iterator_tag>
  *in_stack_ffffffffffffff98;
  random_access_iterator_base<remora::iterators::dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>,_double,_remora::iterators::dense_random_access_iterator_tag>
  *in_stack_ffffffffffffffa0;
  dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffffb0;
  
  *param_3 = 0.0;
  vector_expression<remora::dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(param_1);
  dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>::end
            (in_stack_ffffffffffffffb0);
  vector_expression<remora::dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(param_2);
  dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>::begin
            ((dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag> *)
             in_stack_ffffffffffffff90);
  vector_expression<remora::dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(param_1);
  dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>::begin
            (in_stack_ffffffffffffff90);
  while( true ) {
    bVar1 = iterators::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar1) break;
    pdVar2 = iterators::
             dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>
             ::operator*((dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>
                          *)&stack0xffffffffffffff98);
    dVar3 = *pdVar2;
    pdVar2 = iterators::
             dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>
             ::operator*((dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>
                          *)&stack0xffffffffffffffb0);
    *param_3 = dVar3 * *pdVar2 + *param_3;
    iterators::
    dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>::
    operator++((dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>
                *)&stack0xffffffffffffff98);
    iterators::
    dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>::
    operator++((dense_storage_iterator<const_double,_remora::iterators::dense_random_access_iterator_tag>
                *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

void dot(
	vector_expression<E1, cpu_tag> const& v1,
	vector_expression<E2, cpu_tag> const& v2,
	result_type& result,
	dense_tag,
	dense_tag
) {
	result = result_type();
	auto v1_end = v1().end();
	auto v2_pos = v2().begin();
	for(auto v1_pos = v1().begin(); v1_pos != v1_end; ++v1_pos, ++v2_pos){
		result += (*v1_pos) * (*v2_pos);
	}
}